

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O2

bool __thiscall
LowererMDArch::EmitLoadInt32
          (LowererMDArch *this,Instr *instrLoad,bool conversionFromObjectAllowed,
          bool bailOutOnHelper,LabelInstr *labelBailOut)

{
  undefined2 valueType;
  Opnd *this_00;
  Lowerer *this_01;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BailOutKind BVar4;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  RegOpnd *opndSrc;
  Instr *pIVar7;
  Opnd *pOVar8;
  BranchInstr *instr;
  LabelInstr *pLVar9;
  undefined1 *puVar10;
  undefined **ppuVar11;
  LabelInstr *local_58;
  LabelInstr *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  char local_31;
  ValueType src1ValueType;
  
  bVar2 = IR::Opnd::IsRegOpnd(instrLoad->m_src1);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa74,"(instrLoad->GetSrc1()->IsRegOpnd())",
                       "instrLoad->GetSrc1()->IsRegOpnd()");
    if (!bVar2) goto LAB_005d06b1;
    *puVar5 = 0;
  }
  pOVar8 = instrLoad->m_src1;
  if (pOVar8->m_type != TyVar) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa75,"(instrLoad->GetSrc1()->GetType() == TyVar)",
                       "instrLoad->GetSrc1()->GetType() == TyVar");
    if (!bVar2) goto LAB_005d06b1;
    *puVar5 = 0;
    pOVar8 = instrLoad->m_src1;
  }
  this_00 = instrLoad->m_dst;
  pRVar6 = IR::Opnd::AsRegOpnd(pOVar8);
  local_31 = IR::Opnd::IsTaggedInt(&pRVar6->super_Opnd);
  if ((bool)local_31) {
    bVar2 = false;
  }
  else {
    bVar2 = IR::Opnd::IsNotInt(&pRVar6->super_Opnd);
  }
  bVar3 = IR::Opnd::IsEqual(&pRVar6->super_Opnd,instrLoad->m_dst);
  opndSrc = pRVar6;
  if (!bVar3) {
    opndSrc = IR::RegOpnd::New(TyVar,instrLoad->m_func);
    valueType = (pRVar6->super_Opnd).m_valueType;
    IR::Opnd::SetValueType(&opndSrc->super_Opnd,(ValueType)valueType);
    pIVar7 = IR::Instr::New(MOV,&opndSrc->super_Opnd,&pRVar6->super_Opnd,instrLoad->m_func);
    IR::Instr::InsertBefore(instrLoad,pIVar7);
  }
  local_34 = (opndSrc->super_Opnd).m_valueType.field_0;
  bVar3 = ValueType::IsLikelyFloat((ValueType *)&local_34.field_0);
  if ((bVar3) || (bVar3 = ValueType::IsLikelyUntaggedInt((ValueType *)&local_34.field_0), bVar3)) {
    bVar3 = true;
    if ((instrLoad->field_0x38 & 0x10) != 0) {
      BVar4 = IR::Instr::GetBailOutKind(instrLoad);
      if (BVar4 == BailOutIntOnly) goto LAB_005d03fd;
      BVar4 = IR::Instr::GetBailOutKind(instrLoad);
      bVar3 = BVar4 != BailOutExpectingInteger;
    }
  }
  else {
LAB_005d03fd:
    bVar3 = false;
  }
  if (bVar2 == false) {
    if (local_31 == '\0') {
      if (bVar3) {
        local_40 = (LabelInstr *)0x0;
        local_58 = IR::LabelInstr::New(Label,instrLoad->m_func,false);
      }
      else {
        local_40 = IR::LabelInstr::New(Label,instrLoad->m_func,true);
        local_58 = (LabelInstr *)0x0;
      }
      pLVar9 = local_58;
      if (local_58 == (LabelInstr *)0x0) {
        pLVar9 = local_40;
      }
      LowererMD::GenerateSmIntTest
                (this->lowererMD,&opndSrc->super_Opnd,instrLoad,pLVar9,(Instr **)0x0,false);
    }
    else {
      local_58 = (LabelInstr *)0x0;
      local_40 = (LabelInstr *)0x0;
    }
    pOVar8 = IR::Opnd::UseWithNewType(&opndSrc->super_Opnd,TyInt32,instrLoad->m_func);
    pRVar6 = IR::Opnd::AsRegOpnd(pOVar8);
    pOVar8 = IR::Opnd::UseWithNewType(this_00,TyInt32,instrLoad->m_func);
    pIVar7 = IR::Instr::New(MOV_TRUNC,pOVar8,&pRVar6->super_Opnd,instrLoad->m_func);
    IR::Instr::InsertBefore(instrLoad,pIVar7);
    if (local_31 != '\0') goto LAB_005d0631;
    pLVar9 = IR::Instr::GetOrCreateContinueLabel(instrLoad,false);
    instr = IR::BranchInstr::New(JMP,pLVar9,this->m_func);
    IR::Instr::InsertBefore(instrLoad,&instr->super_Instr);
    if (bVar3) {
      if (local_58 != (LabelInstr *)0x0) {
        IR::Instr::InsertBefore(instrLoad,&local_58->super_Instr);
      }
      if (local_40 == (LabelInstr *)0x0) goto LAB_005d054d;
      goto LAB_005d0561;
    }
LAB_005d05a4:
    if (local_40 != (LabelInstr *)0x0) {
      IR::Instr::InsertBefore(instrLoad,&local_40->super_Instr);
    }
  }
  else {
    if (bailOutOnHelper && !bVar3) {
      bVar2 = GlobOpt::DoEliminateArrayAccessHelperCall(this->m_func);
      if (bVar2) {
        puVar10 = (undefined1 *)__cxa_allocate_exception(1);
        *puVar10 = 0x16;
        ppuVar11 = &Js::RejitException::typeinfo;
      }
      else {
        sourceContextId = Func::GetSourceContextId(this->m_func);
        functionId = Func::GetLocalFunctionId(this->m_func);
        bVar2 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01453738,BailOutPhase,sourceContextId,functionId);
        if (bVar2) {
          Output::Print(L"    Aborting JIT because EliminateArrayAccessHelperCall is already off\n")
          ;
          Output::Flush();
        }
        puVar10 = (undefined1 *)__cxa_allocate_exception(1);
        ppuVar11 = &Js::OperationAbortedException::typeinfo;
      }
      __cxa_throw(puVar10,ppuVar11,0);
    }
    if (local_31 != '\0') goto LAB_005d0631;
    if (bVar3) {
      pLVar9 = (LabelInstr *)0x0;
LAB_005d054d:
      local_40 = IR::LabelInstr::New(Label,instrLoad->m_func,true);
LAB_005d0561:
      if (pLVar9 == (LabelInstr *)0x0) {
        pLVar9 = IR::Instr::GetOrCreateContinueLabel(instrLoad,false);
      }
      pRVar6 = LowererMD::CheckFloatAndUntag(this->lowererMD,opndSrc,instrLoad,local_40);
      LowererMD::ConvertFloatToInt32
                (this->lowererMD,instrLoad->m_dst,&pRVar6->super_Opnd,local_40,pLVar9,instrLoad);
      goto LAB_005d05a4;
    }
  }
  if (((instrLoad->field_0x38 & 0x10) != 0) &&
     ((BVar4 = IR::Instr::GetBailOutKind(instrLoad), BVar4 == BailOutIntOnly ||
      (BVar4 = IR::Instr::GetBailOutKind(instrLoad), BVar4 == BailOutExpectingInteger)))) {
    Lowerer::LoadInt32FromUntaggedVar(this->lowererMD->m_lowerer,instrLoad);
    return true;
  }
  if (!bailOutOnHelper) {
    this_01 = this->lowererMD->m_lowerer;
    if (!conversionFromObjectAllowed) {
      Lowerer::LowerUnaryHelperMemWithBoolReference
                (this_01,instrLoad,HelperConv_ToInt32_NoObjects,true);
      return false;
    }
    Lowerer::LowerUnaryHelperMem(this_01,instrLoad,HelperConv_ToInt32,(Opnd *)0x0);
    return false;
  }
  if (labelBailOut == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xb09,"(labelBailOut)","labelBailOut");
    if (!bVar2) {
LAB_005d06b1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  Lowerer::InsertBranch(Br,labelBailOut,instrLoad);
LAB_005d0631:
  IR::Instr::Remove(instrLoad);
  return false;
}

Assistant:

bool
LowererMDArch::EmitLoadInt32(IR::Instr *instrLoad, bool conversionFromObjectAllowed, bool bailOutOnHelper, IR::LabelInstr * labelBailOut)
{
    //
    //    r1 = MOV src1
    // rtest = MOV src1
    //         SHR rtest, AtomTag_Shift
    //         CMP rtest, 1
    //         JNE $helper or $float
    // r_dst = MOV_TRUNC e_src1
    //         JMP $done
    //  $float:
    //     dst = ConvertToFloat(r1, $helper)
    // $helper:
    // r_dst = ToInt32()
    //

    Assert(instrLoad->GetSrc1()->IsRegOpnd());
    Assert(instrLoad->GetSrc1()->GetType() == TyVar);

    // TODO: Fix bad lowering. We shouldn't see TyVars here.
    // Assert(instrLoad->GetDst()->GetType() == TyInt32);

    bool isInt             = false;
    bool isNotInt          = false;
    IR::Opnd *dst          = instrLoad->GetDst();
    IR::RegOpnd *src1      = instrLoad->GetSrc1()->AsRegOpnd();
    IR::LabelInstr *helper = nullptr;
    IR::LabelInstr *labelFloat = nullptr;
    IR::LabelInstr *done   = nullptr;

    if (src1->IsTaggedInt())
    {
        isInt = true;
    }
    else if (src1->IsNotInt())
    {
        isNotInt = true;
    }

    if (src1->IsEqual(instrLoad->GetDst()) == false)
    {
        // r1 = MOV src1
        IR::RegOpnd *r1 = IR::RegOpnd::New(TyVar, instrLoad->m_func);
        r1->SetValueType(src1->GetValueType());
        instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV, r1, src1, instrLoad->m_func));
        src1 = r1;
    }

    const ValueType src1ValueType(src1->GetValueType());
    const bool doFloatToIntFastPath =
        (src1ValueType.IsLikelyFloat() || src1ValueType.IsLikelyUntaggedInt()) &&
                !(instrLoad->HasBailOutInfo() && (instrLoad->GetBailOutKind() == IR::BailOutIntOnly || instrLoad->GetBailOutKind() == IR::BailOutExpectingInteger));

    if (isNotInt)
    {
        // Known to be non-integer. If we are required to bail out on helper call, just re-jit.
        if (!doFloatToIntFastPath && bailOutOnHelper)
        {
            if(!GlobOpt::DoEliminateArrayAccessHelperCall(this->m_func))
            {
                // Array access helper call removal is already off for some reason. Prevent trying to rejit again
                // because it won't help and the same thing will happen again. Just abort jitting this function.
                if(PHASE_TRACE(Js::BailOutPhase, this->m_func))
                {
                    Output::Print(_u("    Aborting JIT because EliminateArrayAccessHelperCall is already off\n"));
                    Output::Flush();
                }
                throw Js::OperationAbortedException();
            }

            throw Js::RejitException(RejitReason::ArrayAccessHelperCallEliminationDisabled);
        }
    }
    else
    {
        // It could be an integer in this case.
        if (!isInt)
        {
            if(doFloatToIntFastPath)
            {
                labelFloat = IR::LabelInstr::New(Js::OpCode::Label, instrLoad->m_func, false);
            }
            else
            {
                helper = IR::LabelInstr::New(Js::OpCode::Label, instrLoad->m_func, true);
            }

            this->lowererMD->GenerateSmIntTest(src1, instrLoad, labelFloat ? labelFloat : helper);
        }
        IR::RegOpnd *src132 = src1->UseWithNewType(TyInt32, instrLoad->m_func)->AsRegOpnd();
#if !INT32VAR
        // src1 = SAR src1, VarTag_Shift
        instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::SAR,
                                               src132,
                                               src132,
                                               IR::IntConstOpnd::New(Js::VarTag_Shift, TyInt8, instrLoad->m_func),
                                               instrLoad->m_func));

        // r_dst = MOV src1
        // This is only a MOV (and not a MOVSXD) because we do a signed shift right, but we'll copy
        // all 64 bits.


        instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV,
                                               dst->UseWithNewType(TyMachReg, instrLoad->m_func),
                                               src1,
                                               instrLoad->m_func));

#else

        instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV_TRUNC,
                                               dst->UseWithNewType(TyInt32, instrLoad->m_func),
                                               src132,
                                               instrLoad->m_func));
#endif
        if (!isInt)
        {
            // JMP $done
            done = instrLoad->GetOrCreateContinueLabel();
            instrLoad->InsertBefore(IR::BranchInstr::New(Js::OpCode::JMP, done, m_func));
        }
    }

    if (!isInt)
    {
        if(doFloatToIntFastPath)
        {
            if(labelFloat)
            {
                instrLoad->InsertBefore(labelFloat);
            }
            if(!helper)
            {
                helper = IR::LabelInstr::New(Js::OpCode::Label, instrLoad->m_func, true);
            }

            if(!done)
            {
                done = instrLoad->GetOrCreateContinueLabel();
            }
#if FLOATVAR
            IR::RegOpnd* floatOpnd = this->lowererMD->CheckFloatAndUntag(src1, instrLoad, helper);
#else
            this->lowererMD->GenerateFloatTest(src1, instrLoad, helper, instrLoad->HasBailOutInfo());
            IR::IndirOpnd* floatOpnd = IR::IndirOpnd::New(src1, Js::JavascriptNumber::GetValueOffset(), TyMachDouble, this->m_func);
#endif
            this->lowererMD->ConvertFloatToInt32(instrLoad->GetDst(), floatOpnd, helper, done, instrLoad);
        }

        // $helper:
        if (helper)
        {
            instrLoad->InsertBefore(helper);
        }
        if(instrLoad->HasBailOutInfo() && (instrLoad->GetBailOutKind() == IR::BailOutIntOnly || instrLoad->GetBailOutKind() == IR::BailOutExpectingInteger))
        {
            // Avoid bailout if we have a JavascriptNumber whose value is a signed 32-bit integer
            lowererMD->m_lowerer->LoadInt32FromUntaggedVar(instrLoad);

            // Need to bail out instead of calling a helper
            return true;
        }

        if (bailOutOnHelper)
        {
            Assert(labelBailOut);
            lowererMD->m_lowerer->InsertBranch(Js::OpCode::Br, labelBailOut, instrLoad);
            instrLoad->Remove();
        }
        else if (conversionFromObjectAllowed)
        {
            lowererMD->m_lowerer->LowerUnaryHelperMem(instrLoad, IR::HelperConv_ToInt32);
        }
        else
        {
            lowererMD->m_lowerer->LowerUnaryHelperMemWithBoolReference(instrLoad, IR::HelperConv_ToInt32_NoObjects, true /*useBoolForBailout*/);
        }
    }
    else
    {
        instrLoad->Remove();
    }

    return false;
}